

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::switch_modes(Application *this,uint key)

{
  Scene *pSVar1;
  Mesh *this_00;
  Mesh *pMVar2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_48;
  
  if ((int)key < 0x61) {
    if ((int)key < 0x52) {
      if (key == 0x41) {
CMU462_Application_to_animate_mode:
        if (*(int *)&(this->super_Renderer).field_0xc != 2) {
          PathTracer::stop(this->pathtracer);
          PathTracer::clear(this->pathtracer);
          *(undefined4 *)&(this->super_Renderer).field_0xc = 2;
          to_object_action(this);
          pSVar1 = this->scene;
          for (p_Var4 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var4 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            if (*(long *)(p_Var4 + 1) == 0) {
              lVar3 = 0;
            }
            else {
              lVar3 = __dynamic_cast(*(long *)(p_Var4 + 1),&DynamicScene::SceneObject::typeinfo,
                                     &DynamicScene::Mesh::typeinfo,0);
            }
            if (lVar3 != 0) {
              DynamicScene::Scene::addObject(this->scene,*(SceneObject **)(lVar3 + 0x168));
            }
          }
          this->integrator = Forward_Euler;
          this->isGhosted = true;
          pSVar1 = this->scene;
          for (p_Var4 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var4 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            *(undefined1 *)(*(long *)(p_Var4 + 1) + 0xe9) = 1;
          }
        }
        return;
      }
      if (key == 0x4d) {
CMU462_Application_to_model_mode:
        if (*(int *)&(this->super_Renderer).field_0xc != 0) {
          PathTracer::stop(this->pathtracer);
          PathTracer::clear(this->pathtracer);
          *(undefined4 *)&(this->super_Renderer).field_0xc = 0;
          pSVar1 = this->scene;
          for (p_Var4 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var4 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            this_00 = *(Mesh **)(p_Var4 + 1);
            (*(this_00->super_SceneObject)._vptr_SceneObject[5])(&vStack_48,this_00);
            if (*((vStack_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p == 'M') {
              pMVar2 = (Mesh *)this->scene->elementTransform;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&vStack_48);
              if (this_00 != pMVar2) {
                DynamicScene::Mesh::resetWave(this_00);
              }
            }
            else {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&vStack_48);
            }
          }
          this->action = Navigate;
          mouse_moved(this,this->mouseX,this->mouseY);
          this->isGhosted = false;
          pSVar1 = this->scene;
          for (p_Var4 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var4 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            *(undefined1 *)(*(long *)(p_Var4 + 1) + 0xe9) = 0;
          }
        }
        return;
      }
    }
    else {
      if (key == 0x52) {
CMU462_Application_to_render_mode:
        if (*(int *)&(this->super_Renderer).field_0xc != 1) {
          DynamicScene::Scene::triangulateSelection(this->scene);
          set_up_pathtracer(this);
          PathTracer::stop(this->pathtracer);
          PathTracer::start_raytracing(this->pathtracer);
          *(undefined4 *)&(this->super_Renderer).field_0xc = 1;
          this->isGhosted = false;
          pSVar1 = this->scene;
          for (p_Var4 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var4 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            *(undefined1 *)(*(long *)(p_Var4 + 1) + 0xe9) = 0;
          }
        }
        return;
      }
      if (key == 0x56) {
CMU462_Application_to_visualize_mode:
        if (*(int *)&(this->super_Renderer).field_0xc != 3) {
          set_up_pathtracer(this);
          PathTracer::stop(this->pathtracer);
          PathTracer::start_visualizing(this->pathtracer);
          *(undefined4 *)&(this->super_Renderer).field_0xc = 3;
          this->isGhosted = false;
          pSVar1 = this->scene;
          for (p_Var4 = (pSVar1->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var4 != &(pSVar1->objects)._M_t._M_impl.super__Rb_tree_header;
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
            *(undefined1 *)(*(long *)(p_Var4 + 1) + 0xe9) = 0;
          }
        }
        return;
      }
    }
  }
  else if ((int)key < 0x72) {
    if (key == 0x61) goto CMU462_Application_to_animate_mode;
    if (key == 0x6d) goto CMU462_Application_to_model_mode;
  }
  else {
    if (key == 0x72) goto CMU462_Application_to_render_mode;
    if (key == 0x76) goto CMU462_Application_to_visualize_mode;
  }
  return;
}

Assistant:

void Application::switch_modes(unsigned int key) {
  switch (key) {
    case 'a': case 'A':
        to_animate_mode();
        break;
    case 'm': case 'M':
        to_model_mode();
        break;
    case 'r': case 'R':
        to_render_mode();
        break;
    case 'v': case 'V':
        to_visualize_mode();
        break;
    default:
        break;
  }
}